

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall
Graph::Graph(Graph *this,
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *param,int car_capacity,int num_car)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  int j;
  ostream *poVar6;
  Node *pNVar7;
  ulong *puVar8;
  double **ppdVar9;
  double *pdVar10;
  ulong uVar11;
  ulong uVar12;
  int i;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  int *piVar17;
  
  uVar14 = (ulong)num_car;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar14;
  uVar16 = SUB168(auVar5 * ZEXT816(0x30),0) | 8;
  if (SUB168(auVar5 * ZEXT816(0x30),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  this->_vptr_Graph = (_func_int **)&PTR__Graph_00109d88;
  this->num_car = num_car;
  this->num_node =
       (int)(((long)(param->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(param->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  poVar6 = std::operator<<((ostream *)&std::cout,"constructor!");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"num_car:");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,num_car);
  poVar6 = std::operator<<(poVar6," car_capacity:");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,car_capacity);
  poVar6 = std::operator<<(poVar6," num_node(depot + customer):");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->num_node);
  std::endl<char,std::char_traits<char>>(poVar6);
  uVar2 = this->num_node;
  lVar15 = (long)(int)uVar2;
  uVar12 = lVar15 << 5;
  if (lVar15 < 0) {
    uVar12 = 0xffffffffffffffff;
  }
  pNVar7 = (Node *)operator_new__(uVar12);
  this->nodes = pNVar7;
  puVar8 = (ulong *)operator_new__(uVar16);
  *puVar8 = uVar14;
  if (num_car != 0) {
    lVar13 = 0;
    do {
      *(undefined8 *)((long)puVar8 + lVar13 + 0x30) = 0;
      puVar1 = (undefined8 *)((long)puVar8 + lVar13 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar13 = lVar13 + 0x30;
    } while (uVar14 * 0x30 - lVar13 != 0);
  }
  lVar13 = 0;
  uVar16 = 0;
  if (0 < (int)uVar2) {
    uVar16 = (ulong)uVar2;
  }
  this->cars = (Car *)(puVar8 + 1);
  piVar17 = &pNVar7->unload_time;
  for (; uVar16 * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
    piVar4 = *(int **)((long)&(((param->
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data + lVar13);
    piVar17[-5] = *piVar4;
    ((Node *)(piVar17 + -7))->x = piVar4[1];
    piVar17[-6] = piVar4[2];
    piVar17[-4] = piVar4[3];
    *(bool *)(piVar17 + -3) = false;
    piVar17[-2] = piVar4[4];
    iVar3 = piVar4[5];
    piVar17[-1] = iVar3;
    *piVar17 = (int)((double)(iVar3 - piVar4[4]) * 0.2);
    piVar17 = piVar17 + 8;
  }
  uVar12 = 0;
  uVar14 = (ulong)(uint)num_car;
  if (num_car < 1) {
    uVar14 = uVar12;
  }
  for (; uVar14 * 0x30 - uVar12 != 0; uVar12 = uVar12 + 0x30) {
    *(int *)((long)puVar8 + uVar12 + 8) = car_capacity;
    puVar1 = (undefined8 *)((long)puVar8 + uVar12 + 0xc);
    *puVar1 = 0;
    puVar1[1] = 10;
  }
  uVar14 = lVar15 << 3;
  if ((int)uVar2 < 0) {
    uVar14 = 0xffffffffffffffff;
  }
  ppdVar9 = (double **)operator_new__(uVar14);
  this->distance_matrix = ppdVar9;
  for (uVar12 = 0; uVar12 != uVar16; uVar12 = uVar12 + 1) {
    pdVar10 = (double *)operator_new__(uVar14);
    ppdVar9[uVar12] = pdVar10;
    ppdVar9 = this->distance_matrix;
    for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
      ppdVar9[uVar12][uVar11] = 0.0;
    }
  }
  calc_node_distance(this);
  return;
}

Assistant:

Graph::Graph(std::vector<std::vector<int> > param,
				int car_capacity, int num_car)
{
	this->num_car = num_car;
	this->num_node = param.size(); 

	std::cout << "constructor!" << std::endl;
	std::cout << "num_car:" << num_car << " car_capacity:" \
		<< car_capacity << " num_node(depot + customer):" << num_node << std::endl;

	nodes = new Node[num_node];
	cars = new Car[num_car];

	for(int i = 0; i < num_node; i++){
		nodes[i].idx = param[i][0];
		nodes[i].x = param[i][1];
		nodes[i].y = param[i][2];
		nodes[i].demand = param[i][3];
		nodes[i].visited = false;
		//time windows
		nodes[i].tw_open = param[i][4];
		nodes[i].tw_close = param[i][5];
		nodes[i].unload_time = (int)(0.2 * (param[i][5] - param[i][4]));
	}

	for(int i = 0; i < num_car; i++){
		cars[i].car_capacity = car_capacity;
		cars[i].now_load = 0;
		cars[i].now_idx = 0;
		//time windows
		cars[i].car_speed = 10;
		cars[i].now_time = 0;
	}

	distance_matrix = new double* [num_node]; 
	for(int i = 0; i < num_node; i++){
		distance_matrix[i] = new double [num_node];
		for(int j = 0; j < num_node; j++){
			distance_matrix[i][j] = 0;// initialization all elements in a row
		}
	}
	calc_node_distance();
}